

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

char NpyArray::getTypeChar(type_info *t)

{
  bool bVar1;
  type_info *t_local;
  
  bVar1 = std::type_info::operator==(t,(type_info *)&float::typeinfo);
  if (bVar1) {
    t_local._7_1_ = 'f';
  }
  else {
    bVar1 = std::type_info::operator==(t,(type_info *)&double::typeinfo);
    if (bVar1) {
      t_local._7_1_ = 'f';
    }
    else {
      bVar1 = std::type_info::operator==(t,(type_info *)&long_double::typeinfo);
      if (bVar1) {
        t_local._7_1_ = 'f';
      }
      else {
        bVar1 = std::type_info::operator==(t,(type_info *)&int::typeinfo);
        if (bVar1) {
          t_local._7_1_ = 'i';
        }
        else {
          bVar1 = std::type_info::operator==(t,(type_info *)&char::typeinfo);
          if (bVar1) {
            t_local._7_1_ = 'i';
          }
          else {
            bVar1 = std::type_info::operator==(t,(type_info *)&short::typeinfo);
            if (bVar1) {
              t_local._7_1_ = 'i';
            }
            else {
              bVar1 = std::type_info::operator==(t,(type_info *)&long::typeinfo);
              if (bVar1) {
                t_local._7_1_ = 'i';
              }
              else {
                bVar1 = std::type_info::operator==(t,(type_info *)&long_long::typeinfo);
                if (bVar1) {
                  t_local._7_1_ = 'i';
                }
                else {
                  bVar1 = std::type_info::operator==(t,(type_info *)&unsigned_char::typeinfo);
                  if (bVar1) {
                    t_local._7_1_ = 'u';
                  }
                  else {
                    bVar1 = std::type_info::operator==(t,(type_info *)&unsigned_short::typeinfo);
                    if (bVar1) {
                      t_local._7_1_ = 'u';
                    }
                    else {
                      bVar1 = std::type_info::operator==(t,(type_info *)&unsigned_long::typeinfo);
                      if (bVar1) {
                        t_local._7_1_ = 'u';
                      }
                      else {
                        bVar1 = std::type_info::operator==
                                          (t,(type_info *)&unsigned_long_long::typeinfo);
                        if (bVar1) {
                          t_local._7_1_ = 'u';
                        }
                        else {
                          bVar1 = std::type_info::operator==(t,(type_info *)&unsigned_int::typeinfo)
                          ;
                          if (bVar1) {
                            t_local._7_1_ = 'u';
                          }
                          else {
                            bVar1 = std::type_info::operator==(t,(type_info *)&bool::typeinfo);
                            if (bVar1) {
                              t_local._7_1_ = 'b';
                            }
                            else {
                              bVar1 = std::type_info::operator==
                                                (t,(type_info *)&std::complex<float>::typeinfo);
                              if (bVar1) {
                                t_local._7_1_ = 'c';
                              }
                              else {
                                bVar1 = std::type_info::operator==
                                                  (t,(type_info *)&std::complex<double>::typeinfo);
                                if (bVar1) {
                                  t_local._7_1_ = 'c';
                                }
                                else {
                                  bVar1 = std::type_info::operator==
                                                    (t,(type_info *)
                                                       &std::complex<long_double>::typeinfo);
                                  if (bVar1) {
                                    t_local._7_1_ = 'c';
                                  }
                                  else {
                                    t_local._7_1_ = '?';
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return t_local._7_1_;
}

Assistant:

char NpyArray::getTypeChar(const std::type_info& t)
{
	if (t == typeid(float)) return 'f';
	if (t == typeid(double)) return 'f';
	if (t == typeid(long double)) return 'f';

	if (t == typeid(int)) return 'i';
	if (t == typeid(char)) return 'i';
	if (t == typeid(short)) return 'i';
	if (t == typeid(long)) return 'i';
	if (t == typeid(long long)) return 'i';

	if (t == typeid(uint8_t)) return 'u';
	if (t == typeid(unsigned short)) return 'u';
	if (t == typeid(unsigned long)) return 'u';
	if (t == typeid(unsigned long long)) return 'u';
	if (t == typeid(unsigned int)) return 'u';

	if (t == typeid(bool)) return 'b';

	if (t == typeid(std::complex<float>)) return 'c';
	if (t == typeid(std::complex<double>)) return 'c';
	if (t == typeid(std::complex<long double>)) return 'c';

	return '?';
}